

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteLimits(WatWriter *this,Limits *limits)

{
  if (limits->is_64 == true) {
    Writef(this,"i64");
  }
  Writef(this,"%lu",limits->initial);
  if (limits->has_max == true) {
    Writef(this,"%lu",limits->max);
  }
  if (limits->is_shared == true) {
    Writef(this,"shared");
    return;
  }
  return;
}

Assistant:

void WatWriter::WriteLimits(const Limits& limits) {
  if (limits.is_64) {
    Writef("i64");
  }
  Writef("%" PRIu64, limits.initial);
  if (limits.has_max) {
    Writef("%" PRIu64, limits.max);
  }
  if (limits.is_shared) {
    Writef("shared");
  }
}